

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
find<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,StringPtr *params)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  StringPtr *pSVar8;
  StringPtr *in_R8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  ulong uVar6;
  
  pSVar8 = table.ptr;
  if (pSVar8[1].content.size_ == 0) {
    *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
    aVar7.value = table.size_;
  }
  else {
    uVar4 = hashCode<kj::StringPtr&>(in_R8);
    uVar5 = _::chooseBucket((uint)(uVar4 != 0),(uint)pSVar8[1].content.size_);
    uVar6 = (ulong)uVar5;
    aVar7 = extraout_RDX;
    while( true ) {
      pcVar2 = pSVar8[1].content.ptr;
      iVar1 = *(int *)(pcVar2 + uVar6 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(pcVar2 + uVar6 * 8) == (uint)(uVar4 != 0))) &&
         (bVar3 = String::operator==((String *)((ulong)(iVar1 - 2) * 0x20 + table.size_),in_R8),
         aVar7 = extraout_RDX_00, bVar3)) {
        iVar1 = *(int *)(pcVar2 + uVar6 * 8 + 4);
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_00164239;
      }
      uVar9 = uVar6 + 1;
      uVar6 = 0;
      if (uVar9 != pSVar8[1].content.size_) {
        uVar6 = uVar9 & 0xffffffff;
      }
    }
    *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
  }
LAB_00164239:
  MVar10.ptr.field_1.value = aVar7.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }